

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O2

void __thiscall ItemWrapper::ItemWrapper(ItemWrapper *this,Item *item,itemLocation l)

{
  string in_stack_ffffffffffffffc8;
  
  Item::Item(&this->classItem,item);
  this->location = l;
  Action::Action(&this->defaultAction,NO_ACTION);
  this->state = DEFAULT;
  (this->itemName)._M_dataplus._M_p = (pointer)&(this->itemName).field_2;
  (this->itemName)._M_string_length = 0;
  (this->itemName).field_2._M_local_buf[0] = '\0';
  Item::getName_abi_cxx11_((string *)&stack0xffffffffffffffc8,item);
  setItemName(this,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

ItemWrapper::ItemWrapper(Item item, itemLocation l) : classItem(item), location(l),
defaultAction(Action(NO_ACTION)), state(DEFAULT){
    setItemName(item.getName());
}